

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

PSocketAddress * p_socket_get_remote_address(PSocket *socket,PError **error)

{
  unsigned_long error_00;
  int iVar1;
  pint pVar2;
  PErrorIO code;
  PSocketAddress *ret;
  undefined1 local_a0 [4];
  socklen_t len;
  sockaddr_storage buffer;
  PError **error_local;
  PSocket *socket_local;
  
  buffer.__ss_align = (unsigned_long)error;
  if (socket == (PSocket *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local = (PSocket *)0x0;
  }
  else {
    ret._4_4_ = 0x80;
    iVar1 = getpeername(socket->fd,(sockaddr *)local_a0,(socklen_t *)((long)&ret + 4));
    error_00 = buffer.__ss_align;
    if (iVar1 < 0) {
      pVar2 = p_error_get_last_net();
      code = p_error_get_io_from_system(pVar2);
      pVar2 = p_error_get_last_net();
      p_error_set_error_p((PError **)error_00,code,pVar2,
                          "Failed to call getpeername() to get remote socket address");
      socket_local = (PSocket *)0x0;
    }
    else {
      socket_local = (PSocket *)p_socket_address_new_from_native(local_a0,(ulong)ret._4_4_);
      if ((PSocketAddress *)socket_local == (PSocketAddress *)0x0) {
        p_error_set_error_p((PError **)buffer.__ss_align,0x20a,0,
                            "Failed to create socket address from native structure");
      }
    }
  }
  return (PSocketAddress *)socket_local;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_get_remote_address (const PSocket	*socket,
			     PError		**error)
{
	struct sockaddr_storage	buffer;
	socklen_t 		len;
	PSocketAddress		*ret;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	len = sizeof (buffer);

	if (P_UNLIKELY (getpeername (socket->fd, (struct sockaddr *) &buffer, &len) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getpeername() to get remote socket address");
		return NULL;
	}

#ifdef P_OS_SYLLABLE
	/* Syllable has a bug with a wrong byte order for a TCP port,
	 * as it only supports IPv4 we can easily fix it here. */
	((struct sockaddr_in *) &buffer)->sin_port =
			p_htons (((struct sockaddr_in *) &buffer)->sin_port);
#endif

	ret = p_socket_address_new_from_native (&buffer, (psize) len);

	if (P_UNLIKELY (ret == NULL))
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to create socket address from native structure");

	return ret;
}